

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O0

int lws_spa_finalize(lws_spa *spa)

{
  lws_spa *spa_local;
  
  if (spa != (lws_spa *)0x0) {
    if (spa->s != (lws_urldecode_stateful *)0x0) {
      lws_urldecode_s_destroy(spa,spa->s);
      spa->s = (lws_urldecode_stateful *)0x0;
    }
    spa->finalized = '\x01';
  }
  return 0;
}

Assistant:

int
lws_spa_finalize(struct lws_spa *spa)
{
	if (!spa)
		return 0;

	if (spa->s) {
		lws_urldecode_s_destroy(spa, spa->s);
		spa->s = NULL;
	}

	spa->finalized = 1;

	return 0;
}